

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddBYEPacket
          (RTCPCompoundPacketBuilder *this,uint32_t *ssrcs,uint8_t numssrcs,void *reasondata,
          uint8_t reasonlength)

{
  size_t sVar1;
  size_t sVar2;
  size_t numbytes;
  uint16_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  RTPMemoryManager *mgr;
  Buffer local_a0;
  ulong local_90;
  size_t i;
  size_t offset;
  long lStack_78;
  uint8_t srcindex;
  uint32_t *sources;
  RTCPCommonHeader *hdr;
  size_t numwords;
  uint8_t *buf;
  size_t totalotherbytes;
  size_t r;
  size_t zerobytes;
  size_t packsize;
  void *pvStack_30;
  uint8_t reasonlength_local;
  void *reasondata_local;
  uint32_t *puStack_20;
  uint8_t numssrcs_local;
  uint32_t *ssrcs_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else if (numssrcs < 0x20) {
    zerobytes = (ulong)numssrcs * 4 + 4;
    r = 0;
    if (reasonlength != '\0') {
      zerobytes = (ulong)reasonlength + (ulong)numssrcs * 4 + 5;
      totalotherbytes = zerobytes & 3;
      if (totalotherbytes != 0) {
        r = 4 - totalotherbytes;
        zerobytes = r + zerobytes;
      }
    }
    sVar1 = this->appsize;
    sVar2 = this->byesize;
    packsize._7_1_ = reasonlength;
    pvStack_30 = reasondata;
    reasondata_local._7_1_ = numssrcs;
    puStack_20 = ssrcs;
    ssrcs_local = (uint32_t *)this;
    sVar5 = SDES::NeededBytes(&this->sdes);
    sVar6 = Report::NeededBytes(&this->report);
    numbytes = zerobytes;
    buf = (uint8_t *)(sVar1 + sVar2 + sVar5 + sVar6);
    if ((uint8_t *)this->maximumpacketsize < buf + zerobytes) {
      this_local._4_4_ = -0x2b;
    }
    else {
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      sources = (uint32_t *)operator_new__(numbytes,mgr,4);
      if (sources == (uint32_t *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        *(byte *)sources = (byte)*sources & 0x3f | 0x80;
        *(byte *)sources = (byte)*sources & 0xdf;
        *(byte *)sources = (byte)*sources & 0xe0 | reasondata_local._7_1_ & 0x1f;
        hdr = (RTCPCommonHeader *)(zerobytes >> 2);
        numwords = (size_t)sources;
        uVar3 = htons((short)hdr - 1);
        *(uint16_t *)((long)sources + 2) = uVar3;
        *(undefined1 *)((long)sources + 1) = 0xcb;
        lStack_78 = numwords + 4;
        for (offset._7_1_ = 0; offset._7_1_ < reasondata_local._7_1_;
            offset._7_1_ = offset._7_1_ + 1) {
          uVar4 = htonl(puStack_20[offset._7_1_]);
          *(uint32_t *)(lStack_78 + (ulong)offset._7_1_ * 4) = uVar4;
        }
        if (packsize._7_1_ != 0) {
          i = (ulong)reasondata_local._7_1_ * 4 + 4;
          *(byte *)(numwords + i) = packsize._7_1_;
          memcpy((void *)(numwords + i + 1),pvStack_30,(ulong)packsize._7_1_);
          for (local_90 = 0; local_90 < r; local_90 = local_90 + 1) {
            *(undefined1 *)(numwords + ((zerobytes - 1) - local_90)) = 0;
          }
        }
        Buffer::Buffer(&local_a0,(uint8_t *)numwords,zerobytes);
        std::__cxx11::
        list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
        ::push_back(&this->byepackets,&local_a0);
        this->byesize = zerobytes + this->byesize;
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -0x2d;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::AddBYEPacket(uint32_t *ssrcs,uint8_t numssrcs,const void *reasondata,uint8_t reasonlength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

	if (numssrcs > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_TOOMANYSSRCS;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*((size_t)numssrcs);
	size_t zerobytes = 0;
	
	if (reasonlength > 0)
	{
		packsize += 1; // 1 byte for the length;
		packsize += (size_t)reasonlength;

		size_t r = (packsize&0x03);
		if (r != 0)
		{
			zerobytes = 4-r;
			packsize += zerobytes;
		}
	}

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t numwords;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = numssrcs;
	
	numwords = packsize/sizeof(uint32_t);
	hdr->length = htons((uint16_t)(numwords-1));
	hdr->packettype = RTP_RTCPTYPE_BYE;
	
	uint32_t *sources = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	uint8_t srcindex;
	
	for (srcindex = 0 ; srcindex < numssrcs ; srcindex++)
		sources[srcindex] = htonl(ssrcs[srcindex]);

	if (reasonlength != 0)
	{
		size_t offset = sizeof(RTCPCommonHeader)+((size_t)numssrcs)*sizeof(uint32_t);

		buf[offset] = reasonlength;
		memcpy((buf+offset+1),reasondata,(size_t)reasonlength);
		for (size_t i = 0 ; i < zerobytes ; i++)
			buf[packsize-1-i] = 0;
	}

	byepackets.push_back(Buffer(buf,packsize));
	byesize += packsize;
	
	return 0;
}